

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_external_decode_block
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out_,int *out_size)

{
  undefined8 uVar1;
  char *__src;
  void *pvVar2;
  undefined1 auVar3 [16];
  double local_60;
  cram_block *out;
  cram_block *b;
  char *cp;
  int i;
  int *out_size_local;
  char *out__local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  out = (cram_block *)0x0;
  if (slice->block_by_id == (cram_block **)0x0) {
    cp._4_4_ = 0;
    while ((cp._4_4_ < slice->hdr->num_blocks &&
           (((out = slice->block[cp._4_4_], out == (cram_block *)0x0 ||
             (out->content_type != EXTERNAL)) || (out->content_id != (c->field_6).huffman.ncodes))))
          ) {
      cp._4_4_ = cp._4_4_ + 1;
    }
    if ((cp._4_4_ == slice->hdr->num_blocks) || (out == (cram_block *)0x0)) {
      return -1;
    }
  }
  else {
    out = slice->block_by_id[(c->field_6).huffman.ncodes];
    if (out == (cram_block *)0x0) {
      if (*out_size == 0) {
        return 0;
      }
      return -1;
    }
  }
  __src = cram_extract_block(out,*out_size);
  if (__src == (char *)0x0) {
    slice_local._4_4_ = -1;
  }
  else {
    while (*(ulong *)(out_ + 0x28) <= (ulong)(*(long *)(out_ + 0x30) + (long)*out_size)) {
      if (*(long *)(out_ + 0x28) == 0) {
        local_60 = 1024.0;
      }
      else {
        uVar1 = *(undefined8 *)(out_ + 0x28);
        auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
        auVar3._0_8_ = uVar1;
        auVar3._12_4_ = 0x45300000;
        local_60 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
      }
      *(long *)(out_ + 0x28) =
           (long)local_60 | (long)(local_60 - 9.223372036854776e+18) & (long)local_60 >> 0x3f;
      pvVar2 = realloc(*(void **)(out_ + 0x20),*(size_t *)(out_ + 0x28));
      *(void **)(out_ + 0x20) = pvVar2;
    }
    memcpy((void *)(*(long *)(out_ + 0x20) + *(long *)(out_ + 0x30)),__src,(long)*out_size);
    *(long *)(out_ + 0x30) = (long)*out_size + *(long *)(out_ + 0x30);
    slice_local._4_4_ = 0;
  }
  return slice_local._4_4_;
}

Assistant:

static int cram_external_decode_block(cram_slice *slice, cram_codec *c,
				      cram_block *in, char *out_,
				      int *out_size) {
    int i;
    char *cp;
    cram_block *b = NULL;
    cram_block *out = (cram_block *)out_;

    /* Find the external block */
    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->external.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->external.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    cp = cram_extract_block(b, *out_size);
    if (!cp)
	return -1;

    BLOCK_APPEND(out, cp, *out_size);
    return 0;
}